

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetPropertyEntry *pTVar2;
  pointer pcVar3;
  cmLocalGenerator *this;
  pointer pbVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  string *psVar8;
  undefined4 extraout_var;
  cmSourceFile *this_00;
  string *psVar9;
  ostream *poVar10;
  long *plVar11;
  cmake *pcVar12;
  size_type *psVar13;
  long lVar14;
  pointer pbVar15;
  char *pcVar16;
  pointer sourceName;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar17;
  undefined4 local_2a4;
  string e;
  undefined4 local_27c;
  string fullPath;
  string local_250;
  TargetPropertyEntry *local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_210 [2];
  long local_200 [2];
  pointer local_1f0;
  cmGeneratorExpressionDAGChecker *local_1e8;
  string *local_1e0;
  pointer local_1d8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1d0;
  __hashtable *__h;
  cmMakefile *local_1c0;
  cmListFileBacktrace local_1b8;
  string usedSources;
  ios_base local_138 [264];
  
  local_1e8 = dagChecker;
  local_1e0 = config;
  local_1d0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs;
  __h = &uniqueSrcs->_M_h;
  local_1c0 = cmTarget::GetMakefile(tgt->Target);
  local_1d8 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (entries->
              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d8 == local_1f0) {
    bVar6 = 0;
  }
  else {
    local_27c = SUB84(local_1f0,0);
    local_2a4 = 0;
    do {
      pTVar2 = *local_1d8;
      psVar8 = cmLinkItem::AsStr_abi_cxx11_(&pTVar2->LinkImplItem->super_cmLinkItem);
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      local_230 = pTVar2;
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      iVar7 = (*pTVar2->_vptr_TargetPropertyEntry[2])
                        (pTVar2,tgt->LocalGenerator,local_1e0,0,tgt,tgt,local_1e8,
                         (cmGeneratorTarget *)&usedSources);
      cmSystemTools::ExpandListArgument((string *)CONCAT44(extraout_var,iVar7),&entrySources,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      iVar7 = (*local_230->_vptr_TargetPropertyEntry[6])();
      pbVar15 = entrySources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((char)iVar7 != '\0') {
        local_2a4 = 1;
      }
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      if (entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
      }
      else {
        do {
          this_00 = cmMakefile::GetOrCreateSource(local_1c0,sourceName,false,Ambiguous);
          e._M_dataplus._M_p = (pointer)&e.field_2;
          e._M_string_length = 0;
          e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
          psVar9 = cmSourceFile::GetFullPath(this_00,&e);
          pcVar3 = (psVar9->_M_dataplus)._M_p;
          fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&fullPath,pcVar3,pcVar3 + psVar9->_M_string_length);
          if (fullPath._M_string_length == 0) {
            if (e._M_string_length != 0) {
              pcVar12 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&usedSources);
              cmake::IssueMessage(pcVar12,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
              if (usedSources._M_string_length != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           usedSources._M_string_length);
              }
            }
LAB_002b3d1f:
            bVar5 = false;
            local_27c = local_2a4;
          }
          else {
            if ((psVar8->_M_string_length != 0) &&
               (bVar5 = cmsys::SystemTools::FileIsFullPath(sourceName), !bVar5)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
              if (psVar8->_M_string_length == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&usedSources,
                           "Found relative path while evaluating sources of \"",0x31);
                psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&usedSources,(psVar9->_M_dataplus)._M_p,
                                     psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\":\n  \"",6);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(sourceName->_M_dataplus)._M_p,
                                     sourceName->_M_string_length);
                lVar14 = 2;
                pcVar16 = "\"\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&usedSources,"Target \"",8);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&usedSources,(psVar8->_M_dataplus)._M_p,
                                     psVar8->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36)
                ;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(sourceName->_M_dataplus)._M_p,
                                     sourceName->_M_string_length);
                lVar14 = 1;
                pcVar16 = "\"";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar16,lVar14);
              this = tgt->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_250);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
              std::ios_base::~ios_base(local_138);
              goto LAB_002b3d1f;
            }
            bVar5 = true;
            std::__cxx11::string::_M_assign((string *)sourceName);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
            operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)e._M_dataplus._M_p != &e.field_2) {
            operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
          }
          pbVar4 = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (!bVar5) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entrySources);
            bVar6 = (byte)local_27c;
            goto LAB_002b419b;
          }
          sourceName = sourceName + 1;
          paVar1 = &fullPath.field_2;
        } while (sourceName != pbVar15);
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        pbVar15 = entrySources.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (entrySources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            entrySources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            e._M_dataplus._M_p = (pointer)__h;
            pVar17 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)__h,pbVar15,&e);
            if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (*local_230->_vptr_TargetPropertyEntry[4])(&e);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                        (local_1d0,pbVar15,(cmListFileBacktrace *)&e);
              if (e._M_string_length != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._M_string_length);
              }
              if (debugSources) {
                std::operator+(&fullPath," * ",pbVar15);
                plVar11 = (long *)std::__cxx11::string::append((char *)&fullPath);
                e._M_dataplus._M_p = (pointer)&e.field_2;
                psVar13 = (size_type *)(plVar11 + 2);
                if ((size_type *)*plVar11 == psVar13) {
                  e.field_2._M_allocated_capacity = *psVar13;
                  e.field_2._8_8_ = plVar11[3];
                }
                else {
                  e.field_2._M_allocated_capacity = *psVar13;
                  e._M_dataplus._M_p = (pointer)*plVar11;
                }
                e._M_string_length = plVar11[1];
                *plVar11 = (long)psVar13;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&usedSources,(ulong)e._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)e._M_dataplus._M_p != &e.field_2) {
                  operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)fullPath._M_dataplus._M_p != paVar1) {
                  operator_delete(fullPath._M_dataplus._M_p,
                                  fullPath.field_2._M_allocated_capacity + 1);
                }
              }
            }
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar4);
          if (usedSources._M_string_length != 0) {
            pcVar12 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
            local_210[0] = local_200;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_210,"Used sources for target ","");
            psVar8 = cmTarget::GetName_abi_cxx11_(tgt->Target);
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)local_210,(ulong)(psVar8->_M_dataplus)._M_p);
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_250.field_2._M_allocated_capacity = *psVar13;
              local_250.field_2._8_8_ = plVar11[3];
            }
            else {
              local_250.field_2._M_allocated_capacity = *psVar13;
              local_250._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_250._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_250);
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar13) {
              fullPath.field_2._M_allocated_capacity = *psVar13;
              fullPath.field_2._8_8_ = plVar11[3];
              fullPath._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              fullPath.field_2._M_allocated_capacity = *psVar13;
              fullPath._M_dataplus._M_p = (pointer)*plVar11;
            }
            fullPath._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&fullPath,(ulong)usedSources._M_dataplus._M_p);
            e._M_dataplus._M_p = (pointer)&e.field_2;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar13) {
              e.field_2._M_allocated_capacity = *psVar13;
              e.field_2._8_8_ = plVar11[3];
            }
            else {
              e.field_2._M_allocated_capacity = *psVar13;
              e._M_dataplus._M_p = (pointer)*plVar11;
            }
            e._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            (*local_230->_vptr_TargetPropertyEntry[4])(&local_1b8);
            cmake::IssueMessage(pcVar12,LOG,&e,&local_1b8);
            if (local_1b8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b8.TopEntry.
                         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)e._M_dataplus._M_p != &e.field_2) {
              operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != paVar1) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_210[0] != local_200) {
              operator_delete(local_210[0],local_200[0] + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      local_1d8 = local_1d8 + 1;
    } while (local_1d8 != local_1f0);
    bVar6 = (byte)local_2a4;
  }
LAB_002b419b:
  return (bool)(bVar6 & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& srcs,
  std::unordered_set<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt, tgt,
                                                      dagChecker),
                                      entrySources);

    if (entry->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::string& src : entrySources) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entrySources) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry->GetBacktrace());
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry->GetBacktrace());
    }
  }
  return contextDependent;
}